

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O2

int arkStep_SetOrder(ARKodeMem ark_mem,int ord)

{
  int iVar1;
  int iVar2;
  ARKodeARKStepMem step_mem;
  sunindextype Bliw;
  sunindextype Blrw;
  
  iVar1 = arkStep_AccessStepMem(ark_mem,"arkStep_SetOrder",&step_mem);
  if (iVar1 == 0) {
    iVar2 = 4;
    if (0 < ord) {
      iVar2 = ord;
    }
    step_mem->q = iVar2;
    step_mem->stages = 0;
    step_mem->p = 0;
    step_mem->istage = 0;
    ARKodeButcherTable_Space(step_mem->Be,&Bliw,&Blrw);
    ARKodeButcherTable_Free(step_mem->Be);
    step_mem->Be = (ARKodeButcherTable)0x0;
    ark_mem->liw = ark_mem->liw - Bliw;
    ark_mem->lrw = ark_mem->lrw - Blrw;
    ARKodeButcherTable_Space(step_mem->Bi,&Bliw,&Blrw);
    ARKodeButcherTable_Free(step_mem->Bi);
    step_mem->Bi = (ARKodeButcherTable)0x0;
    ark_mem->liw = ark_mem->liw - Bliw;
    ark_mem->lrw = ark_mem->lrw - Blrw;
  }
  return iVar1;
}

Assistant:

int arkStep_SetOrder(ARKodeMem ark_mem, int ord)
{
  ARKodeARKStepMem step_mem;
  sunindextype Blrw, Bliw;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* set user-provided value, or default, depending on argument */
  if (ord <= 0) { step_mem->q = Q_DEFAULT; }
  else { step_mem->q = ord; }

  /* clear Butcher tables, since user is requesting a change in method
     or a reset to defaults.  Tables will be set in ARKInitialSetup. */
  step_mem->stages = 0;
  step_mem->istage = 0;
  step_mem->p      = 0;

  ARKodeButcherTable_Space(step_mem->Be, &Bliw, &Blrw);
  ARKodeButcherTable_Free(step_mem->Be);
  step_mem->Be = NULL;
  ark_mem->liw -= Bliw;
  ark_mem->lrw -= Blrw;

  ARKodeButcherTable_Space(step_mem->Bi, &Bliw, &Blrw);
  ARKodeButcherTable_Free(step_mem->Bi);
  step_mem->Bi = NULL;
  ark_mem->liw -= Bliw;
  ark_mem->lrw -= Blrw;

  return (ARK_SUCCESS);
}